

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckIs(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint code;
  
  pcVar1 = node->element;
  pcVar2 = strchr(pcVar1,0x2d);
  if ((pcVar2 != pcVar1 && -1 < (long)pcVar2 - (long)pcVar1) && pcVar2 != (char *)0x0) {
    prvTidyReportAttrError(doc,node,attval,0x227);
  }
  if ((attval == (AttVal *)0x0) || (pcVar1 = attval->value, pcVar1 == (char *)0x0)) {
    code = 0x256;
  }
  else {
    pcVar2 = strchr(pcVar1,0x2d);
    pcVar3 = strchr(pcVar1,0x20);
    if (((pcVar3 == (char *)0x0) && (pcVar2 != (char *)0x0)) &&
       (pcVar2 != pcVar1 && -1 < (long)pcVar2 - (long)pcVar1)) {
      return;
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckIs( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    const char *ptr;
    Bool go = yes;

    /* `is` MUST NOT be in an autonomous custom tag */
    ptr = strchr(node->element, '-');
    if ( ( ptr && (ptr - node->element > 0) ) )
    {
        TY_(ReportAttrError)( doc, node, attval, ATTRIBUTE_IS_NOT_ALLOWED);
    }

    /* Even if we fail the above test, we'll continue to emit reports because
       the user should *also* know that his attribute values are wrong, even
       if they shouldn't be in custom tags anyway. */

    /* `is` MUST have a value */
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* `is` MUST contain a hyphen and no space. */
    ptr = strchr(attval->value, '-');
    go = ( ptr && (ptr - attval->value > 0) );
    ptr = strchr(attval->value, ' ');
    go = go & (ptr == NULL);
    if ( !go )
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
}